

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O1

string * __thiscall BmsBuffer::ToString_abi_cxx11_(string *__return_storage_ptr__,BmsBuffer *this)

{
  _Rb_tree_color x;
  _Rb_tree_node_base *p_Var1;
  uint uVar2;
  
  if ((int)(this->array_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    p_Var1 = (this->array_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    x = p_Var1[1]._M_color;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    for (; (_Rb_tree_header *)p_Var1 != &(this->array_)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      x = BmsUtil::GCD(x,p_Var1[1]._M_color);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
    if ((int)(this->array_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      uVar2 = 0;
      do {
        Get((BmsBuffer *)&stack0xffffffffffffffcc,(barindex)this);
        BmsWord::ToCharPtr((BmsWord *)&stack0xffffffffffffffcc);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        BmsWord::~BmsWord((BmsWord *)&stack0xffffffffffffffcc);
        uVar2 = uVar2 + x;
      } while (uVar2 < (uint)(this->array_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsBuffer::ToString(void) const
{
	if (this->GetObjectCount() == 0) {
		return "";
	}

	// calculate GCD (minimize output string)
	unsigned int step = Begin()->first;
	for (auto it = ++Begin(); it != End(); ++it) {
		step = BmsUtil::GCD(step, it->first);
	}

	std::string tmp;
	tmp.reserve(this->GetObjectCount() / step * 2);
	for (unsigned int i = 0; i < this->GetObjectCount(); i += step) {
		tmp.append(Get(i).ToCharPtr());
	}
	return tmp;
}